

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O1

void __thiscall
flow_cutter::MultiCutter::
init<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch,flow_cutter::PierceNodeScore>
          (MultiCutter *this,
          Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
          *graph,TemporaryData *tmp,BreadthFirstSearch *search_algo,
          PierceNodeScore *score_pierce_node,DistanceType dist_type,
          vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_> *p,
          int max_flow_intensity,int random_seed,bool should_skip_non_maximum_sides)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  pointer pSVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  pointer pDVar11;
  int iVar12;
  int iVar13;
  DistanceAwareCutter *this_00;
  int local_6c;
  MultiCutter *local_68;
  int local_60;
  DistanceType local_5c;
  anon_class_16_2_5167d1e9 local_58;
  PierceNodeScore *local_48;
  anon_class_16_2_0ed2c766 my_score_pierce_node;
  
  pDVar11 = (this->cutter_list).
            super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pDVar11 -
          (long)(this->cutter_list).
                super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_5c = dist_type;
  local_48 = score_pierce_node;
  while (uVar5 = (lVar4 >> 6) * -0x5c87b5f9d4d1bc25,
        uVar8 = (long)(p->
                      super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(p->
                      super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3,
        uVar8 <= uVar5 && uVar5 - uVar8 != 0) {
    (this->cutter_list).
    super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
    ._M_impl.super__Vector_impl_data._M_finish = pDVar11 + -1;
    __gnu_cxx::new_allocator<flow_cutter::DistanceAwareCutter>::
    destroy<flow_cutter::DistanceAwareCutter>
              ((new_allocator<flow_cutter::DistanceAwareCutter> *)this,pDVar11 + -1);
    pDVar11 = (this->cutter_list).
              super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    lVar4 = (long)pDVar11 -
            (long)(this->cutter_list).
                  super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  }
  while ((ulong)(((long)(this->cutter_list).
                        super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->cutter_list).
                        super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 6) * -0x5c87b5f9d4d1bc25) <
         (ulong)((long)(p->
                       super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(p->
                       super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 3)) {
    std::vector<flow_cutter::DistanceAwareCutter,std::allocator<flow_cutter::DistanceAwareCutter>>::
    emplace_back<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>const&>
              ((vector<flow_cutter::DistanceAwareCutter,std::allocator<flow_cutter::DistanceAwareCutter>>
                *)this,graph);
  }
  local_6c = 0;
  pSVar6 = (p->
           super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (uint)((ulong)((long)(p->
                               super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6) >> 3);
  local_68 = this;
  if (0 < (int)uVar7) {
    local_60 = random_seed + 1;
    do {
      this_00 = (local_68->cutter_list).
                super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                ._M_impl.super__Vector_impl_data._M_start + local_6c;
      my_score_pierce_node.score_pierce_node = local_48;
      my_score_pierce_node.i = &local_6c;
      DistanceAwareCutter::
      init<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch>
                (this_00,graph,tmp,search_algo,local_5c,pSVar6[local_6c],max_flow_intensity,
                 local_6c + local_60);
      if (should_skip_non_maximum_sides) {
        while (local_58.score_pierce_node = (anon_class_16_2_0ed2c766 *)&my_score_pierce_node,
              local_58.this = this_00,
              bVar3 = BasicCutter::
                      does_next_advance_increase_cut<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_ben_strasser[P]flow_cutter_pace20_src_flow_cutter_h:825:37)>
                                (&this_00->cutter,graph,&local_58), !bVar3) {
          local_58.score_pierce_node = (anon_class_16_2_0ed2c766 *)&my_score_pierce_node;
          local_58.this = this_00;
          BasicCutter::
          advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>,_flow_cutter::BreadthFirstSearch,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_ben_strasser[P]flow_cutter_pace20_src_flow_cutter_h:810:37)>
                    (&this_00->cutter,graph,tmp,search_algo,(anon_class_16_2_5167d1e9 *)&local_58);
        }
      }
      local_6c = local_6c + 1;
      pSVar6 = (p->
               super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar7 = (uint)((ulong)((long)(p->
                                   super__Vector_base<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6) >> 3)
      ;
    } while (local_6c < (int)uVar7);
  }
  if ((int)uVar7 < 1) {
    iVar12 = -1;
  }
  else {
    pDVar11 = (local_68->cutter_list).
              super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = 0x7fffffff;
    iVar12 = -1;
    lVar4 = 0;
    iVar10 = 0;
    iVar13 = 0;
    do {
      iVar1 = *(int *)((long)(pDVar11->cutter).assimilated + lVar4);
      iVar2 = *(int *)((long)(pDVar11->cutter).reachable + lVar4);
      if ((iVar2 == iVar1) &&
         (iVar9 = *(int *)((long)(pDVar11->cutter).assimilated + lVar4 + 0x40),
         iVar1 <= iVar9 ||
         *(int *)((long)(pDVar11->node_dist + 0xfffffffffffffffa) + lVar4) != iVar9)) {
        iVar9 = 0;
      }
      else {
        iVar9 = 1;
      }
      if ((int)((ulong)(*(long *)((long)(pDVar11->cutter).assimilated +
                                 lVar4 + 0x30 + (ulong)(uint)(iVar9 << 6)) -
                       *(long *)((long)(pDVar11->cutter).assimilated +
                                lVar4 + 0x28 + (ulong)(uint)(iVar9 << 6))) >> 2) < (int)uVar5) {
LAB_0012d40a:
        if ((iVar2 == iVar1) &&
           (iVar12 = *(int *)((long)(pDVar11->cutter).assimilated + lVar4 + 0x40),
           iVar1 <= iVar12 ||
           *(int *)((long)(pDVar11->node_dist + 0xfffffffffffffffa) + lVar4) != iVar12)) {
          iVar12 = 0;
        }
        else {
          iVar12 = 1;
        }
        if ((iVar2 == iVar1) &&
           (iVar13 = *(int *)((long)(pDVar11->cutter).assimilated + lVar4 + 0x40),
           iVar1 <= iVar13 ||
           *(int *)((long)(pDVar11->node_dist + 0xfffffffffffffffa) + lVar4) != iVar13)) {
          iVar13 = 0;
        }
        else {
          iVar13 = 1;
        }
        uVar5 = (ulong)(*(long *)((long)(pDVar11->cutter).assimilated +
                                 lVar4 + 0x30 + (ulong)(uint)(iVar12 << 6)) -
                       *(long *)((long)(pDVar11->cutter).assimilated +
                                lVar4 + 0x28 + (ulong)(uint)(iVar12 << 6))) >> 2;
        iVar13 = *(int *)((long)(pDVar11->cutter).assimilated + lVar4 + (ulong)(uint)(iVar13 << 6));
        iVar12 = iVar10;
      }
      else {
        if ((iVar2 == iVar1) &&
           (iVar9 = *(int *)((long)(pDVar11->cutter).assimilated + lVar4 + 0x40),
           iVar1 <= iVar9 ||
           *(int *)((long)(pDVar11->node_dist + 0xfffffffffffffffa) + lVar4) != iVar9)) {
          iVar9 = 0;
        }
        else {
          iVar9 = 1;
        }
        if ((int)uVar5 ==
            (int)((ulong)(*(long *)((long)(pDVar11->cutter).assimilated +
                                   lVar4 + 0x30 + (ulong)(uint)(iVar9 << 6)) -
                         *(long *)((long)(pDVar11->cutter).assimilated +
                                  lVar4 + 0x28 + (ulong)(uint)(iVar9 << 6))) >> 2)) {
          if ((iVar2 == iVar1) &&
             (iVar9 = *(int *)((long)(pDVar11->cutter).assimilated + lVar4 + 0x40),
             iVar1 <= iVar9 ||
             *(int *)((long)(pDVar11->node_dist + 0xfffffffffffffffa) + lVar4) != iVar9)) {
            iVar9 = 0;
          }
          else {
            iVar9 = 1;
          }
          if (iVar13 < *(int *)((long)(pDVar11->cutter).assimilated +
                               lVar4 + (ulong)(uint)(iVar9 << 6))) goto LAB_0012d40a;
        }
      }
      iVar10 = iVar10 + 1;
      lVar4 = lVar4 + 0x14c0;
    } while ((ulong)uVar7 * 0x14c0 - lVar4 != 0);
  }
  local_68->current_cutter_id = iVar12;
  pDVar11 = (local_68->cutter_list).
            super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar13 = *(int *)pDVar11[iVar12].cutter.assimilated;
  if ((pDVar11[iVar12].cutter.reachable[0].node_set.node_count_inside_ == iVar13) &&
     (iVar10 = (((AssimilatedNodeSet *)((long)pDVar11[iVar12].cutter.assimilated + 0x40))->node_set)
               .node_count_inside_,
     iVar13 <= iVar10 ||
     (((ReachableNodeSet *)((long)pDVar11[iVar12].cutter.reachable + 0x38))->node_set).
     node_count_inside_ != iVar10)) {
    iVar13 = 0;
  }
  else {
    iVar13 = 1;
  }
  local_68->current_smaller_side_size =
       *(int *)((long)pDVar11[iVar12].cutter.assimilated + (ulong)(uint)(iVar13 << 6));
  return;
}

Assistant:

void init(const Graph& graph, TemporaryData& tmp,
        const SearchAlgorithm& search_algo,
        const ScorePierceNode& score_pierce_node, DistanceType dist_type,
        const std::vector<SourceTargetPair>& p, int max_flow_intensity, int random_seed,
        bool should_skip_non_maximum_sides = true)
    {
        while (cutter_list.size() > p.size())
            cutter_list.pop_back(); // can not use resize because that requires
                // default constructor...
        while (cutter_list.size() < p.size())
            cutter_list.emplace_back(graph);

        for (int i = 0; i < (int)p.size(); ++i) {
            auto& x = cutter_list[i];
            auto my_score_pierce_node = [&](int x, int side,
                                            bool causes_augmenting_path,
                                            int source_dist, int target_dist) {
                return score_pierce_node(x, side, causes_augmenting_path, source_dist,
                    target_dist, i);
            };

            x.init(graph, tmp, search_algo, dist_type, p[i], max_flow_intensity, random_seed + 1 + i);
            if (should_skip_non_maximum_sides)
                while (!x.does_next_advance_increase_cut(graph, my_score_pierce_node))
                    x.advance(graph, tmp, search_algo, my_score_pierce_node);
        }

        int best_cutter_id = -1;
        int best_cut_size = std::numeric_limits<int>::max();
        int best_cutter_weight = 0;

        for (int i = 0; i < (int)p.size(); ++i) {
            auto& x = cutter_list[i];
            if ((int)x.get_current_cut().size() < best_cut_size || ((int)x.get_current_cut().size() == best_cut_size && x.get_current_smaller_cut_side_size() > best_cutter_weight)) {
                best_cutter_id = i;
                best_cut_size = x.get_current_cut().size();
                best_cutter_weight = x.get_current_smaller_cut_side_size();
            }
        }

        current_cutter_id = best_cutter_id;
        current_smaller_side_size = cutter_list[current_cutter_id].get_current_smaller_cut_side_size();
    }